

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O2

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  int iVar1;
  void *pvVar2;
  WORD32 WVar3;
  IV_API_CALL_STATUS_T IVar4;
  codec_t *ps_codec;
  ihevcd_cxa_ctl_degrade_op_t *ps_op;
  
  pvVar2 = ps_codec_obj->pv_codec_handle;
  if (*(int *)((long)pvVar2 + 0x78) != 1) {
    *(uint *)((long)pv_api_op + 4) = *(uint *)((long)pv_api_op + 4) | 0x40d0;
    return 1;
  }
  iVar1 = *(int *)((long)pv_api_ip + 8);
  switch(iVar1) {
  case 0:
    ihevcd_get_status(ps_codec_obj,pv_api_ip,pv_api_op);
    break;
  case 1:
    WVar3 = ihevcd_set_params(ps_codec_obj,pv_api_ip,pv_api_op);
    return WVar3;
  case 2:
    ihevcd_reset(ps_codec_obj,pv_api_ip,pv_api_op);
    break;
  case 3:
    *(undefined8 *)((long)pvVar2 + 0x44) = 0x7fffffff;
    *(undefined8 *)((long)pvVar2 + 0x10) = 0;
    *(undefined4 *)((long)pvVar2 + 0x68) = 0;
    goto LAB_0010d844;
  case 4:
    *(undefined4 *)((long)pvVar2 + 100) = 1;
    *(undefined4 *)((long)pv_api_op + 4) = 0;
    *(undefined8 *)((long)pvVar2 + 0x88) = 0;
    break;
  case 5:
    ihevcd_get_buf_info(ps_codec_obj,pv_api_ip,pv_api_op);
    break;
  case 6:
    *(undefined4 *)((long)pv_api_op + 4) = 0;
    if (((int)*(UWORD32 *)((long)pv_api_ip + 0x18) < 1) ||
       (IVar4 = ihevcd_get_version(*(CHAR **)((long)pv_api_ip + 0x10),
                                   *(UWORD32 *)((long)pv_api_ip + 0x18)), IVar4 != IV_SUCCESS)) {
      *(undefined4 *)((long)pv_api_op + 4) = 0xd9;
    }
    break;
  case 7:
    *(undefined4 *)((long)pvVar2 + 0x18) = *(undefined4 *)((long)pv_api_ip + 0xc);
LAB_0010d844:
    *(undefined4 *)((long)pv_api_op + 4) = 0;
    break;
  case 8:
    ihevcd_set_processor(ps_codec_obj,pv_api_ip,pv_api_op);
    break;
  default:
    if (iVar1 == 0x107) {
      ihevcd_get_frame_dimensions(ps_codec_obj,pv_api_ip,pv_api_op);
    }
    else {
      if (iVar1 == 0x108) {
        WVar3 = ihevcd_get_vui_params(ps_codec_obj,pv_api_ip,pv_api_op);
        return WVar3;
      }
      if (iVar1 == 0x109) {
        WVar3 = ihevcd_get_sei_mastering_params(ps_codec_obj,pv_api_ip,pv_api_op);
        return WVar3;
      }
      if (iVar1 == 0x307) {
        *(undefined4 *)((long)pvVar2 + 0x2c) = *(undefined4 *)((long)pv_api_ip + 0x14);
        *(undefined8 *)((long)pvVar2 + 0x24) = *(undefined8 *)((long)pv_api_ip + 0xc);
        *(undefined4 *)((long)pv_api_op + 4) = 0;
        *(undefined4 *)((long)pvVar2 + 0x30) = 0;
      }
    }
  }
  return 0;
}

Assistant:

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj, void *pv_api_ip, void *pv_api_op)
{
    ivd_ctl_set_config_ip_t *ps_ctl_ip;
    ivd_ctl_set_config_op_t *ps_ctl_op;
    WORD32 ret = 0;
    WORD32 subcommand;
    codec_t *ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;

    ps_ctl_ip = (ivd_ctl_set_config_ip_t *)pv_api_ip;
    ps_ctl_op = (ivd_ctl_set_config_op_t *)pv_api_op;

    if(ps_codec->i4_init_done != 1)
    {
        ps_ctl_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_ctl_op->u4_error_code |= IHEVCD_INIT_NOT_DONE;
        return IV_FAIL;
    }
    subcommand = ps_ctl_ip->e_sub_cmd;

    switch(subcommand)
    {
        case IVD_CMD_CTL_GETPARAMS:
            ret = ihevcd_get_status(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETPARAMS:
            ret = ihevcd_set_params(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_RESET:
            ret = ihevcd_reset(ps_codec_obj, (void *)pv_api_ip,
                               (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETDEFAULT:
        {
            ivd_ctl_set_config_op_t *s_ctl_dynparams_op =
                            (ivd_ctl_set_config_op_t *)pv_api_op;

            ret = ihevcd_set_default_params(ps_codec);
            if(IV_SUCCESS == ret)
                s_ctl_dynparams_op->u4_error_code = 0;
            break;
        }
        case IVD_CMD_CTL_FLUSH:
            ret = ihevcd_set_flush_mode(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETBUFINFO:
            ret = ihevcd_get_buf_info(ps_codec_obj, (void *)pv_api_ip,
                                      (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETVERSION:
        {
            ivd_ctl_getversioninfo_ip_t *ps_ip;
            ivd_ctl_getversioninfo_op_t *ps_op;
            IV_API_CALL_STATUS_T ret;
            ps_ip = (ivd_ctl_getversioninfo_ip_t *)pv_api_ip;
            ps_op = (ivd_ctl_getversioninfo_op_t *)pv_api_op;

            ps_op->u4_error_code = IV_SUCCESS;

            if((WORD32)ps_ip->u4_version_buffer_size <= 0)
            {
                ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                ret = IV_FAIL;
            }
            else
            {
                ret = ihevcd_get_version((CHAR *)ps_ip->pv_version_buffer,
                                         ps_ip->u4_version_buffer_size);
                if(ret != IV_SUCCESS)
                {
                    ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                    ret = IV_FAIL;
                }
            }
        }
            break;
        case IHEVCD_CXA_CMD_CTL_DEGRADE:
            ret = ihevcd_set_degrade(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_NUM_CORES:
            ret = ihevcd_set_num_cores(ps_codec_obj, (void *)pv_api_ip,
                                       (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_BUFFER_DIMENSIONS:
            ret = ihevcd_get_frame_dimensions(ps_codec_obj, (void *)pv_api_ip,
                                              (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_VUI_PARAMS:
            ret = ihevcd_get_vui_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_SEI_MASTERING_PARAMS:
            ret = ihevcd_get_sei_mastering_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_PROCESSOR:
            ret = ihevcd_set_processor(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        default:
            DEBUG("\nDo nothing\n");
            break;
    }

    return ret;
}